

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O2

void __thiscall serialize_tests::with_params_move::test_method(with_params_move *this)

{
  iterator pvVar1;
  iterator in_R9;
  string *psVar2;
  long in_FS_OFFSET;
  Span<const_std::byte> sp;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  Base base2;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  Base base1;
  char *local_100;
  char *local_f8;
  undefined **local_f0;
  undefined1 local_e8;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,_serialize_tests::BaseFormat>,_serialize_tests::BaseFormat>,_serialize_tests::BaseFormat>
  pstream;
  UncopyableStream stream;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sp.m_size = 3;
  sp.m_data = (byte *)0xc833eb;
  DataStream::DataStream(&stream.super_DataStream,sp);
  pvVar1 = "";
  ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>
  ::
  ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat,serialize_tests::BaseFormat,serialize_tests::BaseFormat>
            ((ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>
              *)&pstream,(UncopyableStream *)&stream.super_DataStream,(BaseFormat *)&RAW,
             (BaseFormat *)&HEX,(BaseFormat *)&RAW);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1a1;
  file.m_begin = (iterator)&local_c0;
  msg.m_end = in_R9;
  msg.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d0,msg);
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_011480b0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_f8 = "";
  DataStream::str_abi_cxx11_
            (&local_58,&pstream.m_substream.m_substream.m_substream.super_DataStream);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (&local_f0,&local_100,0x1a1,1,2,psVar2,"pstream.GetStream().str()","abc","\"abc\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
    super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
         super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  pstream.m_substream.m_substream.m_substream.super_DataStream.m_read_pos = 0;
  base1.m_base_data = ' ';
  Base::
  Serialize<ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>>
            (&base1,&pstream);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1a6;
  file_00.m_begin = (iterator)&local_118;
  msg_00.m_end = (iterator)psVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_128,
             msg_00);
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_011480b0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_130 = "";
  DataStream::str_abi_cxx11_
            (&local_58,&pstream.m_substream.m_substream.m_substream.super_DataStream);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (&local_f0,&local_138,0x1a6,1,2,psVar2,"pstream.GetStream().str()"," ","\"\\x20\"");
  std::__cxx11::string::~string((string *)&local_58);
  base2.m_base_data = '\x11';
  Base::
  Unserialize<ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>>
            (&base2,&pstream);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1aa;
  file_01.m_begin = (iterator)&local_150;
  msg_01.m_end = (iterator)psVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_160,
             msg_01);
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_011480b0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_168 = "";
  local_58._M_dataplus._M_p._0_4_ = 0x20;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_f0,&local_170,0x1aa,1,2,&base2,"base2.m_base_data",&local_58,"0x20");
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
             &pstream.m_substream.m_substream.m_substream);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(with_params_move)
{
    UncopyableStream stream{MakeByteSpan(std::string_view{"abc"})};
    ParamsStream pstream{std::move(stream), RAW, HEX, RAW};
    BOOST_CHECK_EQUAL(pstream.GetStream().str(), "abc");
    pstream.GetStream().clear();

    Base base1{0x20};
    pstream << base1;
    BOOST_CHECK_EQUAL(pstream.GetStream().str(), "\x20");

    Base base2;
    pstream >> base2;
    BOOST_CHECK_EQUAL(base2.m_base_data, 0x20);
}